

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t scratch_seq_skip(_internal_exr_seq_scratch *scr,int32_t sz)

{
  int in_ESI;
  undefined8 *in_RDI;
  int64_t nread;
  uint64_t nCopy;
  uint64_t nLeft;
  exr_result_t rv;
  uint64_t notdone;
  uint64_t nCopied;
  long local_40;
  ulong local_38;
  ulong local_30;
  int local_24;
  ulong local_20;
  long local_18;
  int local_c;
  undefined8 *local_8;
  
  local_18 = 0;
  local_20 = (ulong)in_ESI;
  local_24 = -1;
  local_c = in_ESI;
  local_8 = in_RDI;
LAB_001471b8:
  do {
    if (local_20 == 0) {
LAB_001472ef:
      if (local_24 == -1) {
        if (local_18 == local_c) {
          local_24 = 0;
        }
        else {
          local_24 = 10;
        }
      }
      return local_24;
    }
    if ((long)local_8[2] < 1) {
      local_40 = 0;
      local_24 = (**(code **)(local_8[6] + 0x28))
                           (local_8[6],*local_8,0x1000,local_8 + 3,&local_40,1);
      if (local_40 < 1) {
        if (local_40 == 0) {
          local_24 = (**(code **)(local_8[6] + 0x40))
                               (local_8[6],10,"End of file attempting to read header");
        }
        goto LAB_001472ef;
      }
      local_8[2] = local_40;
      local_8[1] = 0;
      goto LAB_001471b8;
    }
    local_30 = local_8[2];
    local_38 = local_20;
    if (local_30 < local_20) {
      local_38 = local_30;
    }
    local_8[1] = local_38 + local_8[1];
    local_8[2] = local_8[2] - local_38;
    local_20 = local_20 - local_38;
    local_18 = local_38 + local_18;
  } while( true );
}

Assistant:

static exr_result_t
scratch_seq_skip (struct _internal_exr_seq_scratch* scr, int32_t sz)
{
    uint64_t     nCopied = 0;
    uint64_t     notdone = (uint64_t) sz;
    exr_result_t rv      = -1;

    while (notdone > 0)
    {
        if (scr->navail > 0)
        {
            uint64_t nLeft = (uint64_t) scr->navail;
            uint64_t nCopy = notdone;
            if (nCopy > nLeft) nCopy = nLeft;
            scr->curpos += nCopy;
            scr->navail -= (int64_t) nCopy;
            notdone -= nCopy;
            nCopied += nCopy;
        }
        else
        {
            int64_t nread = 0;
            rv            = scr->ctxt->do_read (
                scr->ctxt,
                scr->scratch,
                SCRATCH_BUFFER_SIZE,
                &(scr->fileoff),
                &nread,
                EXR_ALLOW_SHORT_READ);
            if (nread > 0)
            {
                scr->navail = nread;
                scr->curpos = 0;
            }
            else
            {
                if (nread == 0)
                    rv = scr->ctxt->report_error (
                        scr->ctxt,
                        EXR_ERR_READ_IO,
                        "End of file attempting to read header");
                break;
            }
        }
    }
    if (rv == -1)
    {
        if (nCopied == (uint64_t) sz)
            rv = EXR_ERR_SUCCESS;
        else
            rv = EXR_ERR_READ_IO;
    }
    return rv;
}